

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-abandon.c
# Opt level: O3

void mi_arena_segment_os_mark_abandoned(mi_segment_t *segment)

{
  mi_subproc_t *pmVar1;
  mi_segment_t *pmVar2;
  int err;
  mi_segment_s **ppmVar3;
  
  pmVar1 = segment->subproc;
  err = pthread_mutex_lock((pthread_mutex_t *)&pmVar1->abandoned_os_lock);
  if (err != 0) {
    _mi_error_message(err,"internal error: lock cannot be acquired\n");
  }
  pmVar2 = pmVar1->abandoned_os_list_tail;
  ppmVar3 = &pmVar2->abandoned_os_next;
  if (pmVar2 == (mi_segment_t *)0x0) {
    ppmVar3 = &pmVar1->abandoned_os_list;
  }
  *ppmVar3 = segment;
  pmVar1->abandoned_os_list_tail = segment;
  segment->abandoned_os_prev = pmVar2;
  segment->abandoned_os_next = (mi_segment_s *)0x0;
  LOCK();
  pmVar1->abandoned_os_list_count = pmVar1->abandoned_os_list_count + 1;
  UNLOCK();
  LOCK();
  pmVar1->abandoned_count = pmVar1->abandoned_count + 1;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)&pmVar1->abandoned_os_lock);
  return;
}

Assistant:

static void mi_arena_segment_os_mark_abandoned(mi_segment_t* segment) {
  mi_assert(segment->memid.memkind != MI_MEM_ARENA);
  // not in an arena; we use a list of abandoned segments
  mi_subproc_t* const subproc = segment->subproc;
  mi_lock(&subproc->abandoned_os_lock) {
    // push on the tail of the list (important for the visitor)
    mi_segment_t* prev = subproc->abandoned_os_list_tail;
    mi_assert_internal(prev == NULL || prev->abandoned_os_next == NULL);
    mi_assert_internal(segment->abandoned_os_prev == NULL);
    mi_assert_internal(segment->abandoned_os_next == NULL);
    if (prev != NULL) { prev->abandoned_os_next = segment; }
    else { subproc->abandoned_os_list = segment; }
    subproc->abandoned_os_list_tail = segment;
    segment->abandoned_os_prev = prev;
    segment->abandoned_os_next = NULL;
    mi_atomic_increment_relaxed(&subproc->abandoned_os_list_count);
    mi_atomic_increment_relaxed(&subproc->abandoned_count);
    // and release the lock
  }
  return;
}